

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linklist.h
# Opt level: O0

void quicly_linklist_insert_list(quicly_linklist_t *prev,quicly_linklist_t *l)

{
  int iVar1;
  quicly_linklist_t *in_RSI;
  st_quicly_linklist_t *in_RDI;
  
  iVar1 = quicly_linklist_is_linked(in_RSI);
  if (iVar1 != 0) {
    in_RSI->next->prev = in_RDI;
    in_RSI->prev->next = in_RDI->next;
    in_RDI->next->prev = in_RSI->prev;
    in_RDI->next = in_RSI->next;
    quicly_linklist_init(in_RSI);
  }
  return;
}

Assistant:

inline void quicly_linklist_insert_list(quicly_linklist_t *prev, quicly_linklist_t *l)
{
    if (quicly_linklist_is_linked(l)) {
        l->next->prev = prev;
        l->prev->next = prev->next;
        prev->next->prev = l->prev;
        prev->next = l->next;
        quicly_linklist_init(l);
    }
}